

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_capability(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  imap_conn *imapc;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  *(undefined2 *)((long)&conn->proto + 0xb8) = 0;
  *(undefined2 *)((long)&conn->proto + 0xbc) = 0;
  *(byte *)((long)&conn->proto + 0xfb) = *(byte *)((long)&conn->proto + 0xfb) & 0xfb;
  CVar1 = imap_sendf(data,"CAPABILITY");
  if (CVar1 == CURLE_OK) {
    imap_state(data,IMAP_CAPABILITY);
  }
  return CVar1;
}

Assistant:

static CURLcode imap_perform_capability(struct Curl_easy *data,
                                        struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  imapc->sasl.authmechs = SASL_AUTH_NONE; /* No known auth. mechanisms yet */
  imapc->sasl.authused = SASL_AUTH_NONE;  /* Clear the auth. mechanism used */
  imapc->tls_supported = FALSE;           /* Clear the TLS capability */

  /* Send the CAPABILITY command */
  result = imap_sendf(data, "CAPABILITY");

  if(!result)
    imap_state(data, IMAP_CAPABILITY);

  return result;
}